

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O3

void deqp::gles2::Functional::eval_allEqual_bvec3(ShaderEvalContext *c)

{
  float fVar1;
  int i;
  long lVar2;
  bool bVar3;
  Vector<bool,_3> res_1;
  Vector<bool,_3> res;
  float local_38 [4];
  undefined8 local_28;
  float local_20;
  float local_18 [4];
  undefined8 local_8;
  
  local_18[3] = c->in[0].m_data[2];
  local_8 = *(undefined8 *)c->in[0].m_data;
  local_18[2] = 0.0;
  local_18[0] = 0.0;
  local_18[1] = 0.0;
  res.m_data[0] = false;
  res.m_data[1] = false;
  res.m_data[2] = false;
  lVar2 = 0;
  do {
    res.m_data[lVar2] =
         local_18[lVar2] <= local_18[lVar2 + 3] && local_18[lVar2 + 3] != local_18[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  local_28 = *(undefined8 *)(c->in[1].m_data + 1);
  local_20 = c->in[1].m_data[0];
  local_38[2] = 0.0;
  local_38[0] = 0.0;
  local_38[1] = 0.0;
  res_1.m_data[0] = false;
  res_1.m_data[1] = false;
  res_1.m_data[2] = false;
  lVar2 = 0;
  do {
    fVar1 = *(float *)((long)&local_28 + lVar2 * 4);
    res_1.m_data[lVar2] = local_38[lVar2] <= fVar1 && fVar1 != local_38[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  bVar3 = true;
  lVar2 = 0;
  do {
    if (bVar3) {
      bVar3 = res.m_data[lVar2] == res_1.m_data[lVar2];
    }
    else {
      bVar3 = false;
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  (c->color).m_data[0] = (float)bVar3;
  return;
}

Assistant:

Vector<T, 3>			swizzle		(int a, int b, int c) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); DE_ASSERT(c >= 0 && c < Size); return Vector<T, 3>(m_data[a], m_data[b], m_data[c]); }